

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

void strcpy_url(char *output,char *url,_Bool relative)

{
  byte bVar1;
  _Bool _Var2;
  byte *pbVar3;
  undefined7 in_register_00000011;
  bool bVar4;
  uint c;
  
  pbVar3 = (byte *)url;
  if ((int)CONCAT71(in_register_00000011,relative) == 0) {
    pbVar3 = (byte *)find_host_sep(url);
  }
  bVar4 = true;
  do {
    bVar1 = *url;
    if (bVar1 == 0) {
      *output = 0;
      return;
    }
    if (url < pbVar3) {
      *output = bVar1;
LAB_001462a8:
      output = (char *)((byte *)output + 1);
    }
    else {
      c = (uint)bVar1;
      if (c == 0x20) {
        if (bVar4) {
          ((byte *)output)[0] = 0x25;
          ((byte *)output)[1] = 0x32;
          ((byte *)output)[2] = 0x30;
          output = (char *)((byte *)output + 3);
          bVar4 = true;
        }
        else {
          *output = 0x2b;
          output = (char *)((byte *)output + 1);
          bVar4 = false;
        }
      }
      else {
        if (c == 0x3f) {
          bVar4 = false;
        }
        _Var2 = urlchar_needs_escaping(c);
        if (!_Var2) {
          *output = *url;
          goto LAB_001462a8;
        }
        curl_msnprintf(output,4,"%%%02x",(ulong)(byte)*url);
        output = (char *)((byte *)output + 3);
      }
    }
    url = (char *)((byte *)url + 1);
  } while( true );
}

Assistant:

static void strcpy_url(char *output, const char *url, bool relative)
{
  /* we must add this with whitespace-replacing */
  bool left = TRUE;
  const unsigned char *iptr;
  char *optr = output;
  const unsigned char *host_sep = (const unsigned char *) url;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      *iptr;         /* until zero byte */
      iptr++) {

    if(iptr < host_sep) {
      *optr++ = *iptr;
      continue;
    }

    switch(*iptr) {
    case '?':
      left = FALSE;
      /* FALLTHROUGH */
    default:
      if(urlchar_needs_escaping(*iptr)) {
        msnprintf(optr, 4, "%%%02x", *iptr);
        optr += 3;
      }
      else
        *optr++=*iptr;
      break;
    case ' ':
      if(left) {
        *optr++='%'; /* add a '%' */
        *optr++='2'; /* add a '2' */
        *optr++='0'; /* add a '0' */
      }
      else
        *optr++='+'; /* add a '+' here */
      break;
    }
  }
  *optr = 0; /* null-terminate output buffer */

}